

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_2::ValidateInt32Operand
          (ValidationState_t *_,Instruction *inst,uint32_t operand_index,char *opcode_name,
          char *operand_name)

{
  uint32_t id;
  spv_result_t sVar1;
  bool bVar2;
  uint id_00;
  uint32_t uVar3;
  Instruction *pIVar4;
  DiagnosticStream *pDVar5;
  char *local_230;
  char *local_228;
  string local_220;
  DiagnosticStream local_200;
  
  local_230 = operand_name;
  local_228 = opcode_name;
  id_00 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,(ulong)operand_index);
  pIVar4 = ValidationState_t::FindDef(_,id_00);
  id = (pIVar4->inst_).type_id;
  bVar2 = ValidationState_t::IsIntScalarType(_,id);
  if ((bVar2) && (uVar3 = ValidationState_t::GetBitWidth(_,id), uVar3 == 0x20)) {
    return SPV_SUCCESS;
  }
  ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
  pDVar5 = DiagnosticStream::operator<<(&local_200,&local_228);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar5," ",1);
  pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_230);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar5," type <id> ",0xb);
  ValidationState_t::getIdName_abi_cxx11_(&local_220,_,id);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pDVar5,local_220._M_dataplus._M_p,local_220._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pDVar5," is not a 32 bit integer.",0x19);
  sVar1 = pDVar5->error_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  DiagnosticStream::~DiagnosticStream(&local_200);
  return sVar1;
}

Assistant:

spv_result_t ValidateInt32Operand(ValidationState_t& _, const Instruction* inst,
                                  uint32_t operand_index,
                                  const char* opcode_name,
                                  const char* operand_name) {
  const auto type_id =
      _.FindDef(inst->GetOperandAs<uint32_t>(operand_index))->type_id();
  if (!_.IsIntScalarType(type_id) || _.GetBitWidth(type_id) != 32) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << opcode_name << " " << operand_name << " type <id> "
           << _.getIdName(type_id) << " is not a 32 bit integer.";
  }
  return SPV_SUCCESS;
}